

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qdtls.cpp
# Opt level: O3

void __thiscall QDtlsClientVerifier::QDtlsClientVerifier(QDtlsClientVerifier *this,QObject *parent)

{
  long *plVar1;
  QDtlsClientVerifierPrivate *this_00;
  long in_FS_OFFSET;
  QSslConfiguration conf;
  QSslConfiguration local_28;
  long local_20;
  
  local_20 = *(long *)(in_FS_OFFSET + 0x28);
  this_00 = (QDtlsClientVerifierPrivate *)operator_new(0x80);
  QDtlsClientVerifierPrivate::QDtlsClientVerifierPrivate(this_00);
  QObject::QObject(&this->super_QObject,(QObjectPrivate *)this_00,parent);
  *(undefined ***)this = &PTR_metaObject_002d13c8;
  plVar1 = *(long **)(*(long *)&this->field_0x8 + 0x78);
  if (plVar1 != (long *)0x0) {
    local_28.d.d.ptr = (QSharedDataPointer<QSslConfigurationPrivate>)&DAT_aaaaaaaaaaaaaaaa;
    QSslConfiguration::defaultDtlsConfiguration();
    QSslConfiguration::setPeerVerifyMode(&local_28,VerifyNone);
    (**(code **)(*(long *)((long)plVar1 + *(long *)(*plVar1 + -0x60)) + 0x30))
              ((long)plVar1 + *(long *)(*plVar1 + -0x60),&local_28);
    QSslConfiguration::~QSslConfiguration(&local_28);
  }
  if (*(long *)(in_FS_OFFSET + 0x28) == local_20) {
    return;
  }
  __stack_chk_fail();
}

Assistant:

QDtlsClientVerifier::QDtlsClientVerifier(QObject *parent)
    : QObject(*new QDtlsClientVerifierPrivate, parent)
{
    Q_D(QDtlsClientVerifier);

    if (auto *backend = d->backend.get()) {
        // The default configuration suffices: verifier never does a full
        // handshake and upon verifying a cookie in a client hello message,
        // it reports success.
        auto conf = QSslConfiguration::defaultDtlsConfiguration();
        conf.setPeerVerifyMode(QSslSocket::VerifyNone);
        backend->setConfiguration(conf);
    }
}